

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

bootstrap_analysis *
Catch::Benchmark::Detail::analyse_samples
          (double confidence_level,uint n_resamples,double *first,double *last)

{
  Estimate<double> mean_00;
  Estimate<double> stddev_00;
  bootstrap_analysis *in_RDI;
  double dVar1;
  double outlier_variance;
  int n;
  Estimate<double> stddev_estimate;
  Estimate<double> mean_estimate;
  anon_class_32_4_6f2d8bc5 Estimate;
  _func_double_double_ptr_double_ptr *stddev;
  _func_double_double_ptr_double_ptr *mean;
  _func_double_double_ptr_double_ptr *in_stack_000012a8;
  anon_class_32_4_6f2d8bc5 *in_stack_000012b0;
  undefined8 in_stack_ffffffffffffff60;
  int n_00;
  double in_stack_ffffffffffffff70;
  double in_stack_ffffffffffffff78;
  double in_stack_ffffffffffffff80;
  double in_stack_ffffffffffffff88;
  double in_stack_ffffffffffffff90;
  double in_stack_ffffffffffffff98;
  double in_stack_ffffffffffffffa0;
  double in_stack_ffffffffffffffa8;
  
  n_00 = (int)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  analyse_samples::anon_class_32_4_6f2d8bc5::operator()(in_stack_000012b0,in_stack_000012a8);
  analyse_samples::anon_class_32_4_6f2d8bc5::operator()(in_stack_000012b0,in_stack_000012a8);
  mean_00.lower_bound = in_stack_ffffffffffffff78;
  mean_00.point = in_stack_ffffffffffffff70;
  mean_00.upper_bound = in_stack_ffffffffffffff80;
  mean_00.confidence_interval = in_stack_ffffffffffffff88;
  stddev_00.lower_bound = in_stack_ffffffffffffff98;
  stddev_00.point = in_stack_ffffffffffffff90;
  stddev_00.upper_bound = in_stack_ffffffffffffffa0;
  stddev_00.confidence_interval = in_stack_ffffffffffffffa8;
  dVar1 = anon_unknown_13::outlier_variance(mean_00,stddev_00,n_00);
  (in_RDI->mean).point = in_stack_ffffffffffffff90;
  (in_RDI->mean).lower_bound = in_stack_ffffffffffffff98;
  (in_RDI->mean).upper_bound = in_stack_ffffffffffffffa0;
  (in_RDI->mean).confidence_interval = in_stack_ffffffffffffffa8;
  (in_RDI->standard_deviation).point = in_stack_ffffffffffffff70;
  (in_RDI->standard_deviation).lower_bound = in_stack_ffffffffffffff78;
  (in_RDI->standard_deviation).upper_bound = in_stack_ffffffffffffff80;
  (in_RDI->standard_deviation).confidence_interval = in_stack_ffffffffffffff88;
  in_RDI->outlier_variance = dVar1;
  return in_RDI;
}

Assistant:

bootstrap_analysis analyse_samples(double confidence_level,
                                               unsigned int n_resamples,
                                               double* first,
                                               double* last) {
                auto mean = &Detail::mean;
                auto stddev = &standard_deviation;

#if defined(CATCH_CONFIG_USE_ASYNC)
                auto Estimate = [=](double(*f)(double const*, double const*)) {
                    std::random_device rd;
                    auto seed = rd();
                    return std::async(std::launch::async, [=] {
                        SimplePcg32 rng( seed );
                        auto resampled = resample(rng, n_resamples, first, last, f);
                        return bootstrap(confidence_level, first, last, resampled, f);
                    });
                };

                auto mean_future = Estimate(mean);
                auto stddev_future = Estimate(stddev);

                auto mean_estimate = mean_future.get();
                auto stddev_estimate = stddev_future.get();
#else
                auto Estimate = [=](double(*f)(double const* , double const*)) {
                    std::random_device rd;
                    auto seed = rd();
                    SimplePcg32 rng( seed );
                    auto resampled = resample(rng, n_resamples, first, last, f);
                    return bootstrap(confidence_level, first, last, resampled, f);
                };

                auto mean_estimate = Estimate(mean);
                auto stddev_estimate = Estimate(stddev);
#endif // CATCH_USE_ASYNC

                auto n = static_cast<int>(last - first); // seriously, one can't use integral types without hell in C++
                double outlier_variance = Detail::outlier_variance(mean_estimate, stddev_estimate, n);

                return { mean_estimate, stddev_estimate, outlier_variance };
            }